

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_command_line_params.cpp
# Opt level: O0

bool __thiscall
crnlib::command_line_params::get_value_as_string
          (command_line_params *this,char *pKey,uint index,dynamic_string *value,uint value_index)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  pointer ppVar4;
  dynamic_string *rhs;
  bool bVar5;
  _Self local_48;
  _Self local_40;
  param_map_const_iterator it;
  uint value_index_local;
  dynamic_string *value_local;
  uint index_local;
  char *pKey_local;
  command_line_params *this_local;
  
  it._M_node._4_4_ = value_index;
  local_40._M_node = (_Base_ptr)get_param(this,pKey,index);
  local_48._M_node = (_Base_ptr)end(this);
  bVar2 = std::operator==(&local_40,&local_48);
  uVar1 = it._M_node._4_4_;
  bVar5 = true;
  if (!bVar2) {
    ppVar4 = std::
             _Rb_tree_const_iterator<std::pair<const_crnlib::dynamic_string,_crnlib::command_line_params::param_value>_>
             ::operator->(&local_40);
    uVar3 = vector<crnlib::dynamic_string>::size(&(ppVar4->second).m_values);
    bVar5 = uVar3 <= uVar1;
  }
  if (bVar5) {
    dynamic_string::empty(value);
  }
  else {
    ppVar4 = std::
             _Rb_tree_const_iterator<std::pair<const_crnlib::dynamic_string,_crnlib::command_line_params::param_value>_>
             ::operator->(&local_40);
    rhs = vector<crnlib::dynamic_string>::operator[](&(ppVar4->second).m_values,it._M_node._4_4_);
    dynamic_string::operator=(value,rhs);
  }
  this_local._7_1_ = !bVar5;
  return this_local._7_1_;
}

Assistant:

bool command_line_params::get_value_as_string(const char* pKey, uint index, dynamic_string& value, uint value_index) const
    {
        param_map_const_iterator it = get_param(pKey, index);
        if ((it == end()) || (value_index >= it->second.m_values.size()))
        {
            value.empty();
            return false;
        }

        value = it->second.m_values[value_index];
        return true;
    }